

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

void LTWeather::FillUp(array<float,_13UL> *levels_m,array<float,_13UL> *to,float alt_m,float val,
                      bool bInterpolateNext)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  byte in_DL;
  array<float,_13UL> *in_RDI;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  value_type_conflict1 in_XMM1_Da;
  size_t i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  value_type_conflict1 vVar10;
  undefined4 in_stack_ffffffffffffffa0;
  value_type_conflict1 vVar11;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 local_28;
  
  local_28 = 0;
  while( true ) {
    sVar5 = std::array<float,_13UL>::size(in_RDI);
    bVar4 = false;
    if (local_28 < sVar5) {
      pvVar6 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      bVar4 = *pvVar6 <= in_XMM0_Da;
    }
    if (!bVar4) break;
    pvVar7 = std::array<float,_13UL>::operator[]
                       ((array<float,_13UL> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    *pvVar7 = in_XMM1_Da;
    local_28 = local_28 + 1;
  }
  if (((in_DL & 1) != 0) && (local_28 != 0)) {
    sVar5 = std::array<float,_13UL>::size(in_RDI);
    if (local_28 + 1 < sVar5) {
      pvVar7 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      fVar1 = *pvVar7;
      pvVar7 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      vVar10 = *pvVar7;
      pvVar7 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      fVar8 = vVar10 - *pvVar7;
      pvVar6 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)CONCAT44(fVar8,in_stack_ffffffffffffffa0),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      vVar11 = *pvVar6;
      pvVar6 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)CONCAT44(fVar8,vVar11),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      fVar9 = fVar8 * (vVar11 - *pvVar6);
      pvVar6 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)CONCAT44(fVar8,vVar11),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      fVar2 = *pvVar6;
      pvVar6 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)CONCAT44(fVar8,vVar11),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      fVar3 = *pvVar6;
      pvVar7 = std::array<float,_13UL>::operator[]
                         ((array<float,_13UL> *)CONCAT44(fVar8,vVar11),
                          CONCAT44(vVar10,in_stack_ffffffffffffff98));
      *pvVar7 = fVar1 + fVar9 / (fVar2 - fVar3);
    }
  }
  return;
}

Assistant:

void LTWeather::FillUp (const std::array<float,13>& levels_m,
                        std::array<float,13>& to,
                        float alt_m,
                        float val,
                        bool bInterpolateNext)
{
    std::size_t i = 0;
    for (; i < levels_m.size() && levels_m[i] <= alt_m; ++i)    // while level is less than alt_m set value
        to[i] = val;
    // i now points to first element _after_ those we set to 'val'
    if (bInterpolateNext && i >= 1 && i+1 < levels_m.size()) {        // to align with values above interpolate the next value
        to[i] = to[i-1] + (to[i+1]-to[i-1])*(levels_m[i]-levels_m[i-1])/(levels_m[i+1]-levels_m[i-1]);
    }
}